

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_resampler_init(ma_resampler_config *pConfig,ma_resampler *pResampler)

{
  float *pfVar1;
  double dVar2;
  ma_format mVar3;
  ma_uint32 mVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  anon_struct_4_1_aa2af3df_for_speex aVar9;
  ma_resample_algorithm mVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ma_uint32 mVar13;
  ma_uint32 mVar14;
  ma_uint32 mVar15;
  uint uVar16;
  ma_uint32 t;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ma_result mVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (pResampler == (ma_resampler *)0x0) {
    return -2;
  }
  memset(pResampler,0,0x670);
  if (pConfig == (ma_resampler_config *)0x0) {
    return -2;
  }
  if ((pConfig->format != ma_format_f32) && (pConfig->format != ma_format_s16)) {
    return -2;
  }
  mVar3 = pConfig->format;
  mVar13 = pConfig->channels;
  mVar14 = pConfig->sampleRateIn;
  mVar15 = pConfig->sampleRateOut;
  mVar10 = pConfig->algorithm;
  uVar11 = *(undefined4 *)&pConfig->field_0x14;
  mVar4 = (pConfig->linear).lpfOrder;
  uVar12 = *(undefined4 *)&(pConfig->linear).field_0x4;
  aVar9.quality = (pConfig->speex).quality;
  uVar29 = *(undefined4 *)&pConfig->field_0x2c;
  (pResampler->config).linear.lpfNyquistFactor = (pConfig->linear).lpfNyquistFactor;
  (pResampler->config).speex = (anon_struct_4_1_aa2af3df_for_speex)aVar9.quality;
  *(undefined4 *)&(pResampler->config).field_0x2c = uVar29;
  (pResampler->config).algorithm = mVar10;
  *(undefined4 *)&(pResampler->config).field_0x14 = uVar11;
  (pResampler->config).linear.lpfOrder = mVar4;
  *(undefined4 *)&(pResampler->config).linear.field_0x4 = uVar12;
  (pResampler->config).format = mVar3;
  (pResampler->config).channels = mVar13;
  (pResampler->config).sampleRateIn = mVar14;
  (pResampler->config).sampleRateOut = mVar15;
  if (pConfig->algorithm == ma_resample_algorithm_speex) {
    return -0x67;
  }
  if (pConfig->algorithm != ma_resample_algorithm_linear) {
    return -2;
  }
  mVar3 = pConfig->format;
  mVar4 = pConfig->channels;
  uVar16 = pConfig->sampleRateIn;
  uVar18 = pConfig->sampleRateOut;
  uVar5 = (pConfig->linear).lpfOrder;
  dVar2 = (pConfig->linear).lpfNyquistFactor;
  memset((void *)((long)&pResampler->state + 0x20),0,0x620);
  (pResampler->state).linear.config.format = mVar3;
  (pResampler->state).linear.config.channels = mVar4;
  (pResampler->state).linear.config.sampleRateIn = uVar16;
  (pResampler->state).linear.config.sampleRateOut = uVar18;
  *(ulong *)((long)&pResampler->state + 0x10) = (ulong)uVar5;
  *(double *)((long)&pResampler->state + 0x18) = dVar2;
  uVar21 = uVar18;
  uVar17 = uVar16;
  if (uVar18 == 0 || uVar16 == 0) {
    return -2;
  }
  while (uVar19 = uVar21, uVar19 != 0) {
    uVar21 = uVar17 % uVar19;
    uVar17 = uVar19;
  }
  mVar20 = 0;
  uVar24 = (ulong)uVar16 / (ulong)uVar17;
  uVar16 = (uint)uVar24;
  (pResampler->state).linear.config.sampleRateIn = uVar16;
  uVar23 = (ulong)uVar18 / (ulong)uVar17;
  uVar18 = (uint)uVar23;
  (pResampler->state).linear.config.sampleRateOut = uVar18;
  if ((ulong)uVar5 == 0) {
LAB_0010ee88:
    (pResampler->state).linear.inAdvanceInt = (ma_uint32)(uVar24 / uVar23);
    (pResampler->state).linear.inAdvanceFrac = (ma_uint32)(uVar24 % uVar23);
    *(undefined8 *)((long)&pResampler->state + 0x28) = 1;
  }
  else {
    if (uVar5 < 9) {
      uVar6 = uVar23;
      if (uVar16 < uVar18) {
        uVar6 = uVar24;
      }
      uVar21 = 0;
      memset((void *)((long)&pResampler->state + 0x130),0,0x50c);
      if ((mVar3 == ma_format_f32) || (mVar3 == ma_format_s16)) {
        dVar2 = dVar2 * (double)uVar6 * 0.5;
        if (uVar18 < uVar16) {
          uVar23 = uVar24;
        }
        uVar16 = uVar5 & 1;
        while (uVar21 < uVar16) {
          memset((void *)((long)&pResampler->state + 0x140),0,0x8c);
          if ((mVar3 != ma_format_f32) && (mVar3 != ma_format_s16)) goto LAB_0010ee43;
          (pResampler->state).linear.lpf.lpf1[0].format = mVar3;
          (pResampler->state).linear.lpf.lpf1[0].channels = mVar4;
          dVar7 = exp((dVar2 * -6.283185307179586) / (double)uVar23);
          fVar25 = (float)dVar7;
          if (mVar3 != ma_format_f32) {
            fVar25 = (float)(int)(dVar7 * 16384.0);
          }
          *(float *)((long)&pResampler->state + 0x148) = fVar25;
          uVar21 = 1;
        }
        dVar2 = (dVar2 * 6.283185307179586) / (double)uVar23;
        uVar18 = 1;
        uVar21 = 1;
        for (lVar22 = 0; (ulong)(uVar5 >> 1) * 0x11c != lVar22; lVar22 = lVar22 + 0x11c) {
          uVar17 = uVar21;
          if (uVar16 == 0) {
            uVar17 = uVar18;
          }
          dVar7 = sin(1.5707963705062866 -
                      (double)uVar17 * (3.141592653589793 / (double)(uVar5 << ((byte)uVar16 ^ 1))));
          dVar30 = 1.0 / (dVar7 + dVar7);
          dVar7 = sin(dVar2);
          dVar8 = sin(1.5707963705062866 - dVar2);
          dVar7 = dVar7 / (double)(-(ulong)(dVar30 == 0.0) & 0x3ff6a09edbf8b9bb |
                                  ~-(ulong)(dVar30 == 0.0) & (ulong)(dVar30 + dVar30));
          dVar30 = dVar7 + 1.0;
          memset((void *)((long)&pResampler->state + lVar22 + 0x1cc),0,0x11c);
          if (((dVar30 == 0.0) && (!NAN(dVar30))) ||
             ((mVar3 != ma_format_f32 && (mVar3 != ma_format_s16)))) goto LAB_0010ee43;
          auVar31._8_8_ = 1.0 - dVar7;
          auVar31._0_8_ = dVar8 * -2.0;
          *(ma_format *)((long)&pResampler->state + lVar22 + 0x1cc) = mVar3;
          *(ma_uint32 *)((long)&pResampler->state + lVar22 + 0x1d0) = mVar4;
          auVar33._8_8_ = (1.0 - dVar8) * 0.5;
          auVar33._0_8_ = 1.0 - dVar8;
          uVar29 = (undefined4)((ulong)dVar30 >> 0x20);
          auVar32._8_4_ = SUB84(dVar30,0);
          auVar32._0_8_ = dVar30;
          auVar32._12_4_ = uVar29;
          auVar32 = divpd(auVar31,auVar32);
          auVar34._8_4_ = SUB84(dVar30,0);
          auVar34._0_8_ = dVar30;
          auVar34._12_4_ = uVar29;
          auVar34 = divpd(auVar33,auVar34);
          if (mVar3 == ma_format_f32) {
            fVar25 = (float)auVar34._0_8_;
            fVar26 = (float)auVar34._8_8_;
            fVar27 = (float)auVar32._0_8_;
            fVar28 = (float)auVar32._8_8_;
          }
          else {
            fVar25 = (float)(int)(auVar34._0_8_ * 16384.0);
            fVar26 = (float)(int)(auVar34._8_8_ * 16384.0);
            fVar27 = (float)(int)(auVar32._0_8_ * 16384.0);
            fVar28 = (float)(int)(auVar32._8_8_ * 16384.0);
          }
          *(float *)((long)&pResampler->state + lVar22 + 0x1d4) = fVar26;
          pfVar1 = (float *)((long)&pResampler->state + lVar22 + 0x1d8);
          *pfVar1 = fVar25;
          pfVar1[1] = fVar26;
          pfVar1[2] = fVar27;
          pfVar1[3] = fVar28;
          uVar21 = uVar21 + 1;
          uVar18 = uVar18 + 2;
        }
        (pResampler->state).linear.lpf.lpf1Count = uVar16;
        (pResampler->state).linear.lpf.lpf2Count = uVar5 >> 1;
        (pResampler->state).linear.lpf.format = mVar3;
        (pResampler->state).linear.lpf.channels = mVar4;
        uVar24 = (ulong)(pResampler->state).linear.config.sampleRateIn;
        uVar23 = (ulong)(pResampler->state).linear.config.sampleRateOut;
        goto LAB_0010ee88;
      }
    }
LAB_0010ee43:
    mVar20 = -2;
  }
  return mVar20;
}

Assistant:

MA_API ma_result ma_resampler_init(const ma_resampler_config* pConfig, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    pResampler->config = *pConfig;

    switch (pConfig->algorithm)
    {
        case ma_resample_algorithm_linear:
        {
            ma_linear_resampler_config linearConfig;
            linearConfig = ma_linear_resampler_config_init(pConfig->format, pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut);
            linearConfig.lpfOrder         = pConfig->linear.lpfOrder;
            linearConfig.lpfNyquistFactor = pConfig->linear.lpfNyquistFactor;

            result = ma_linear_resampler_init(&linearConfig, &pResampler->state.linear);
            if (result != MA_SUCCESS) {
                return result;
            }
        } break;

        case ma_resample_algorithm_speex:
        {
        #if defined(MA_HAS_SPEEX_RESAMPLER)
            int speexErr;
            pResampler->state.speex.pSpeexResamplerState = speex_resampler_init(pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut, pConfig->speex.quality, &speexErr);
            if (pResampler->state.speex.pSpeexResamplerState == NULL) {
                return ma_result_from_speex_err(speexErr);
            }
        #else
            /* Speex resampler not available. */
            return MA_NO_BACKEND;
        #endif
        } break;

        default: return MA_INVALID_ARGS;
    }

    return MA_SUCCESS;
}